

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O3

void __thiscall string_string_utf8_Test::TestBody(string_string_utf8_Test *this)

{
  AssertHelperData *pAVar1;
  undefined1 auVar2 [8];
  AssertHelperData *pAVar3;
  char *pcVar4;
  pointer *__ptr;
  int iVar5;
  long lVar6;
  string empty;
  string to_utf8;
  utf32_buffer unicode;
  string from_utf8;
  char32_t empty_data [1];
  AssertHelper local_e8;
  AssertHelper local_e0;
  undefined1 local_d8 [8];
  AssertHelperData *local_d0;
  undefined1 local_c8 [16];
  undefined1 local_b8 [8];
  AssertHelperData *local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [8];
  _Alloc_hider local_90;
  undefined1 local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  string local_38;
  char32_t local_14;
  
  ST::string::from_utf8(&local_38,utf8_test_data,0xffffffffffffffff,check_validity);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_78,"utf8_test_data","from_utf8.c_str()",utf8_test_data,
             local_38.m_buffer.m_chars);
  if ((internal)local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0xfd,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b8,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b8);
    if (local_98 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_98 = (undefined1  [8])0x1c;
  local_b8 = (undefined1  [8])local_38.m_buffer.m_size;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_78,"text_size(utf8_test_data)","from_utf8.size()",
             (unsigned_long *)local_98,(unsigned_long *)local_b8);
  if ((internal)local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_98);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0xfe,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b8,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b8);
    if (local_98 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  ST::utf8_to_utf32((utf32_buffer *)local_78,local_38.m_buffer.m_chars,local_38.m_buffer.m_size,
                    assume_valid);
  local_b8 = (undefined1  [8])((ulong)local_b8 & 0xffffffff00000000);
  iVar5 = *(int *)CONCAT71(local_78._1_7_,local_78[0]);
  local_d8._0_4_ = 0x20;
  if (iVar5 == 0x20) {
    lVar6 = 4;
    do {
      if (local_d8._0_4_ == 0) {
        local_d8._0_4_ = 0;
        goto LAB_001350cb;
      }
      local_d8._0_4_ = *(int *)((long)L" \x7fÿĀ翿\xffff𐀀𐀠\x00040000\x0010ffff" + lVar6);
      iVar5 = *(int *)((long)CONCAT71(local_78._1_7_,local_78[0]) + lVar6);
      lVar6 = lVar6 + 4;
    } while (local_d8._0_4_ == iVar5);
  }
  local_d8._0_4_ = local_d8._0_4_ - iVar5;
LAB_001350cb:
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_98,"0","T_strcmp(test_data, unicode.data())",(int *)local_b8,
             (int *)local_d8);
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_b8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90._M_p ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_90._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x100,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_d8,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d8);
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90._M_p !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90._M_p)
    ;
  }
  ST::string::from_utf32
            ((string *)local_98,L" \x7fÿĀ翿\xffff𐀀𐀠\x00040000\x0010ffff",0xffffffffffffffff
             ,check_validity);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_b8,"utf8_test_data","to_utf8.c_str()",utf8_test_data,(char *)local_98
            );
  if (local_b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_d8);
    if (local_b0 == (AssertHelperData *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_b0;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x104,pcVar4);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    if (local_d8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_d8 + 8))();
    }
  }
  if (local_b0 != (AssertHelperData *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
  }
  pcVar4 = "";
  ST::string::from_utf8((string *)local_b8,"",0xffffffffffffffff,check_validity);
  local_e0.data_._0_4_ = 0;
  local_e8.data_ = local_b0;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_d8,"0U","empty.size()",(uint *)&local_e0,(unsigned_long *)&local_e8);
  if (local_d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (local_d0 != (AssertHelperData *)0x0) {
      pcVar4 = *(char **)local_d0;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x108,pcVar4);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if (local_e8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_e8.data_ + 8))();
    }
  }
  if (local_d0 != (AssertHelperData *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0);
  }
  local_e8.data_ = local_e8.data_ & 0xffffffff00000000;
  local_e0.data_._0_4_ = (int)(char)*(Type *)local_b8;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_d8,"0","T_strcmp(empty.c_str(), \"\")",(int *)&local_e8,
             (int *)&local_e0);
  if (local_d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (local_d0 == (AssertHelperData *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_d0;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x109,pcVar4);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if (local_e8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_e8.data_ + 8))();
    }
  }
  if (local_d0 != (AssertHelperData *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0);
  }
  local_14 = L'\0';
  ST::string::from_utf32((string *)local_d8,&local_14,0xffffffffffffffff,check_validity);
  pAVar3 = local_b0;
  auVar2 = local_b8;
  pAVar1 = local_d0;
  local_b8 = local_d8;
  local_d8 = auVar2;
  local_b0 = local_d0;
  local_d0 = pAVar3;
  local_a8._0_8_ = local_c8._0_8_;
  local_a8._8_8_ = local_c8._8_8_;
  if (pAVar1 < (AssertHelperData *)&DAT_00000010) {
    local_b8 = (undefined1  [8])local_a8;
  }
  if (auVar2 != (undefined1  [8])0x0 && (AssertHelperData *)&DAT_0000000f < pAVar3) {
    operator_delete__((void *)auVar2);
  }
  local_e0.data_._0_4_ = 0;
  local_e8.data_ = local_b0;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_d8,"0U","empty.size()",(uint *)&local_e0,(unsigned_long *)&local_e8);
  if (local_d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (local_d0 == (AssertHelperData *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_d0;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x10d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if (local_e8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_e8.data_ + 8))();
    }
  }
  if (local_d0 != (AssertHelperData *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0);
  }
  local_e8.data_ = local_e8.data_ & 0xffffffff00000000;
  local_e0.data_._0_4_ = (int)(char)*(Type *)local_b8;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_d8,"0","T_strcmp(empty.c_str(), \"\")",(int *)&local_e8,
             (int *)&local_e0);
  if (local_d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (local_d0 == (AssertHelperData *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_d0;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x10e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if (local_e8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_e8.data_ + 8))();
    }
  }
  if (local_d0 != (AssertHelperData *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0);
  }
  if (((AssertHelperData *)&DAT_0000000f < local_b0) && (local_b8 != (undefined1  [8])0x0)) {
    operator_delete__((void *)local_b8);
  }
  if (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_0000000f <
       local_90._M_p) && (local_98 != (undefined1  [8])0x0)) {
    operator_delete__((void *)local_98);
  }
  if (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xb < local_70) &&
     ((void *)CONCAT71(local_78._1_7_,local_78[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_78._1_7_,local_78[0]));
  }
  if (((AssertHelperData *)&DAT_0000000f < local_38.m_buffer.m_size) &&
     (local_38.m_buffer.m_chars != (char *)0x0)) {
    operator_delete__(local_38.m_buffer.m_chars);
  }
  return;
}

Assistant:

TEST(string, string_utf8)
{
    // From UTF-8 to ST::string
    ST::string from_utf8 = ST::string::from_utf8(utf8_test_data);
    EXPECT_STREQ(utf8_test_data, from_utf8.c_str());
    EXPECT_EQ(text_size(utf8_test_data), from_utf8.size());
    ST::utf32_buffer unicode = from_utf8.to_utf32();
    EXPECT_EQ(0, T_strcmp(test_data, unicode.data()));

    // From ST::string to UTF-8
    ST::string to_utf8 = ST::string::from_utf32(test_data);
    EXPECT_STREQ(utf8_test_data, to_utf8.c_str());

    // Empty strings
    ST::string empty = ST::string::from_utf8("");
    EXPECT_EQ(0U, empty.size());
    EXPECT_EQ(0, T_strcmp(empty.c_str(), ""));

    const char32_t empty_data[] = { 0 };
    empty = ST::string::from_utf32(empty_data);
    EXPECT_EQ(0U, empty.size());
    EXPECT_EQ(0, T_strcmp(empty.c_str(), ""));
}